

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

BrotliDecoderErrorCode
DecodeVarLenUint8(BrotliDecoderStateInternal *s,BrotliBitReader *br,uint32_t *value)

{
  BrotliRunningDecodeUint8State BVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  size_t sVar8;
  
  BVar1 = s->substate_decode_uint8;
  if (BVar1 == BROTLI_STATE_DECODE_UINT8_NONE) {
    uVar4 = (ulong)br->bit_pos_;
    if (br->bit_pos_ == 0x40) {
      if (br->avail_in == 0) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar4 = br->val_;
      br->val_ = uVar4 >> 8;
      uVar3 = (ulong)*br->next_in << 0x38 | uVar4 >> 8;
      br->val_ = uVar3;
      br->avail_in = br->avail_in - 1;
      br->next_in = br->next_in + 1;
      uVar4 = 0x38;
    }
    else {
      uVar3 = br->val_;
    }
    uVar5 = (int)uVar4 + 1;
    br->bit_pos_ = uVar5;
    if ((uVar3 >> (uVar4 & 0x3f) & 1) == 0) {
      *value = 0;
      return BROTLI_DECODER_SUCCESS;
    }
  }
  else {
    if (BVar1 != BROTLI_STATE_DECODE_UINT8_SHORT) {
      if (BVar1 != BROTLI_STATE_DECODE_UINT8_LONG) {
        return BROTLI_DECODER_ERROR_UNREACHABLE;
      }
      uVar2 = *value;
      goto LAB_0013fb22;
    }
    uVar5 = br->bit_pos_;
  }
  if (uVar5 - 0x3e < 3) {
    if (br->avail_in == 0) {
      s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_SHORT;
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    uVar4 = br->val_;
    br->val_ = uVar4 >> 8;
    uVar4 = (ulong)*br->next_in << 0x38 | uVar4 >> 8;
    br->val_ = uVar4;
    uVar5 = uVar5 - 8;
    br->avail_in = br->avail_in - 1;
    br->next_in = br->next_in + 1;
  }
  else {
    uVar4 = br->val_;
  }
  uVar4 = uVar4 >> ((byte)uVar5 & 0x3f);
  br->bit_pos_ = uVar5 + 3;
  uVar2 = (uint)uVar4 & 7;
  if ((uVar4 & 7) == 0) {
    *value = 1;
    s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
    return BROTLI_DECODER_SUCCESS;
  }
  *value = uVar2;
LAB_0013fb22:
  uVar5 = br->bit_pos_;
  uVar7 = 0x40 - uVar5;
  if (uVar7 < uVar2) {
    sVar8 = br->avail_in;
    do {
      sVar8 = sVar8 - 1;
      if (sVar8 == 0xffffffffffffffff) {
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_LONG;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar4 = br->val_;
      br->val_ = uVar4 >> 8;
      uVar6 = (ulong)*br->next_in << 0x38 | uVar4 >> 8;
      br->val_ = uVar6;
      uVar5 = uVar5 - 8;
      br->bit_pos_ = uVar5;
      br->avail_in = sVar8;
      br->next_in = br->next_in + 1;
      uVar7 = uVar7 + 8;
    } while (uVar7 < uVar2);
  }
  else {
    uVar6 = br->val_;
  }
  uVar7 = kBitMask[uVar2];
  br->bit_pos_ = uVar5 + uVar2;
  *value = (1 << ((byte)*value & 0x1f)) + ((uint)(uVar6 >> ((byte)uVar5 & 0x3f)) & uVar7);
  s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
  return BROTLI_DECODER_SUCCESS;
}

Assistant:

static BROTLI_NOINLINE BrotliDecoderErrorCode DecodeVarLenUint8(
    BrotliDecoderState* s, BrotliBitReader* br, uint32_t* value) {
  uint32_t bits;
  switch (s->substate_decode_uint8) {
    case BROTLI_STATE_DECODE_UINT8_NONE:
      if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, 1, &bits))) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits == 0) {
        *value = 0;
        return BROTLI_DECODER_SUCCESS;
      }
    /* Fall through. */

    case BROTLI_STATE_DECODE_UINT8_SHORT:
      if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, 3, &bits))) {
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_SHORT;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits == 0) {
        *value = 1;
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
        return BROTLI_DECODER_SUCCESS;
      }
      /* Use output value as a temporary storage. It MUST be persisted. */
      *value = bits;
    /* Fall through. */

    case BROTLI_STATE_DECODE_UINT8_LONG:
      if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, *value, &bits))) {
        s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_LONG;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      *value = (1U << *value) + bits;
      s->substate_decode_uint8 = BROTLI_STATE_DECODE_UINT8_NONE;
      return BROTLI_DECODER_SUCCESS;

    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}